

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlParseJson.c
# Opt level: O0

JL_STATUS ConvertEscapedUnicode
                    (char *String,size_t StringLength,char *ProcessedString,
                    size_t *pProcessedStringPos,size_t *pNumExtraCharsRead)

{
  size_t local_48;
  size_t numUtf8Bytes;
  uint32_t lowSurrogate;
  uint32_t highSurrogate;
  uint32_t number;
  JL_STATUS jlStatus;
  size_t *pNumExtraCharsRead_local;
  size_t *pProcessedStringPos_local;
  char *ProcessedString_local;
  size_t StringLength_local;
  char *String_local;
  
  if (StringLength < 4) {
    highSurrogate = 0xfffffff9;
  }
  else {
    _number = pNumExtraCharsRead;
    pNumExtraCharsRead_local = pProcessedStringPos;
    pProcessedStringPos_local = (size_t *)ProcessedString;
    ProcessedString_local = (char *)StringLength;
    StringLength_local = (size_t)String;
    highSurrogate = VerifyHexString(String,4);
    if (highSurrogate == JL_STATUS_SUCCESS) {
      lowSurrogate = 0;
      __isoc99_sscanf(StringLength_local,"%4x",&lowSurrogate);
      if ((lowSurrogate < 0xd800) || (0xdbff < lowSurrogate)) {
        if ((lowSurrogate < 0xdc00) || (0xdfff < lowSurrogate)) {
          *_number = *_number + 4;
          highSurrogate = 0;
        }
        else {
          highSurrogate = 0xfffffff9;
        }
      }
      else {
        numUtf8Bytes._4_4_ = lowSurrogate;
        if (ProcessedString_local < (char *)0xa) {
          highSurrogate = 0xfffffff9;
        }
        else if ((*(char *)(StringLength_local + 4) == '\\') &&
                (*(char *)(StringLength_local + 5) == 'u')) {
          highSurrogate = VerifyHexString((char *)(StringLength_local + 6),4);
          if (highSurrogate == JL_STATUS_SUCCESS) {
            numUtf8Bytes._0_4_ = 0;
            __isoc99_sscanf(StringLength_local + 6,"%4x",&numUtf8Bytes);
            if (((uint)numUtf8Bytes < 0xdc00) || (0xdfff < lowSurrogate)) {
              highSurrogate = 0xfffffff9;
            }
            else {
              lowSurrogate = ((numUtf8Bytes._4_4_ & 0x3ff) << 10 | (uint)numUtf8Bytes & 0x3ff) +
                             0x10000;
              *_number = *_number + 10;
            }
          }
        }
        else {
          highSurrogate = 0xfffffff9;
        }
      }
      if (highSurrogate == 0) {
        local_48 = 0;
        highSurrogate =
             JlUnicodeValueToUtf8
                       (lowSurrogate,
                        (char *)((long)pProcessedStringPos_local + *pNumExtraCharsRead_local),
                        &local_48);
        if (highSurrogate == JL_STATUS_SUCCESS) {
          *pNumExtraCharsRead_local = local_48 + *pNumExtraCharsRead_local;
        }
      }
    }
  }
  return highSurrogate;
}

Assistant:

static
JL_STATUS
    ConvertEscapedUnicode
    (
        char const*         String,
        size_t              StringLength,
        char*               ProcessedString,
        size_t*             pProcessedStringPos,
        size_t*             pNumExtraCharsRead
    )
{
    JL_STATUS jlStatus;

    if( StringLength >= 4 )
    {
        jlStatus = VerifyHexString( String, 4 );
        if( JL_STATUS_SUCCESS == jlStatus )
        {
            // Convert hex to number
            uint32_t number = 0;
            sscanf( String, "%4x", &number );

            if( number >= 0xD800 && number <= 0xDBFF )
            {
                // This is the high surrogate of a pair, so we need to be able to get the low surrogate next
                uint32_t highSurrogate = number;
                if( StringLength >= 10 )
                {
                    if( '\\' == String[4] && 'u' == String[5] )
                    {
                        jlStatus = VerifyHexString( String+6, 4 );
                        if( JL_STATUS_SUCCESS == jlStatus )
                        {
                            uint32_t lowSurrogate = 0;
                            sscanf( String+6, "%4x", &lowSurrogate );

                            if( lowSurrogate >= 0xDC00 && number <=0xDFFF )
                            {
                                //  Now assemble the surrogate pairs into a single Unicode point
                                number = ( ( ( highSurrogate & 0x03ff ) << 10 )
                                          | ( lowSurrogate & 0x03ff ) )
                                        + 0x10000;

                                *pNumExtraCharsRead += 10;
                            }
                            else
                            {
                                // Second surrogate was also high. This is invalid
                                jlStatus = JL_STATUS_INVALID_DATA;
                            }
                        }
                    }
                    else
                    {
                        // Not a Unicode escape
                        jlStatus = JL_STATUS_INVALID_DATA;
                    }
                }
                else
                {
                    // Not enough room in string for the second half of surrogate pair.
                    jlStatus = JL_STATUS_INVALID_DATA;
                }
            }
            else if( number >= 0xDC00 && number <=0xDFFF )
            {
                // This is the low surrogate of a pair, this can not come first, so this is an invalid string
                jlStatus = JL_STATUS_INVALID_DATA;
            }
            else
            {
                // Regular UTF16 character in BMP plane.
                *pNumExtraCharsRead += 4;
                jlStatus = JL_STATUS_SUCCESS;
            }

            if( JL_STATUS_SUCCESS == jlStatus )
            {
                // number contains the unicode value, now encode it into utf8
                size_t numUtf8Bytes = 0;
                jlStatus = JlUnicodeValueToUtf8( number, ProcessedString+(*pProcessedStringPos), &numUtf8Bytes );
                if( JL_STATUS_SUCCESS == jlStatus )
                {
                    *pProcessedStringPos += numUtf8Bytes;
                }
            }
        }
    }
    else
    {
        // String is too short and does not contain 4 characters after the initial \u
        jlStatus = JL_STATUS_INVALID_DATA;
    }

    return jlStatus;
}